

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data.cpp
# Opt level: O3

void __thiscall setup::data_entry::load(data_entry *this,istream *is,info *i)

{
  ostringstream *poVar1;
  long lVar2;
  tm tm;
  undefined1 auVar3 [48];
  undefined4 uVar4;
  undefined1 uVar5;
  uint uVar6;
  uint32_t uVar7;
  sign_mode sVar8;
  time tVar9;
  logger *plVar10;
  ulong uVar11;
  compression_method cVar12;
  uint64_t uVar13;
  long lVar14;
  stored_flag_reader<flags<setup::data_entry::flags_Enum_,_12UL>_> flagreader;
  char buffer [4];
  char *in_stack_fffffffffffffdf0;
  logger local_1a8;
  
  uVar6 = util::load<unsigned_int,util::little_endian>
                    (is,(ulong)(((i->version).variant._flags.super__Base_bitset<1UL>._M_w & 1) == 0)
                        * 0x10 + 0x10);
  (this->chunk).first_slice = uVar6;
  uVar6 = util::load<unsigned_int,util::little_endian>
                    (is,(ulong)(((i->version).variant._flags.super__Base_bitset<1UL>._M_w & 1) == 0)
                        * 0x10 + 0x10);
  (this->chunk).last_slice = uVar6;
  if ((i->version).value < 0x4000000) {
    uVar7 = (this->chunk).first_slice;
    if (uVar6 == 0 || uVar7 == 0) {
      poVar1 = &local_1a8.buffer;
      local_1a8.level._0_1_ = Warning;
      local_1a8.level._1_1_ = Debug >> 8;
      local_1a8.level._2_2_ = Debug >> 0x10;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"Unexpected slice number: ",0x19);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," to ",4);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      logger::~logger(&local_1a8);
    }
    else {
      (this->chunk).first_slice = uVar7 - 1;
      (this->chunk).last_slice = uVar6 - 1;
    }
  }
  std::istream::read((char *)is,(long)&local_1a8);
  uVar7 = CONCAT22(local_1a8.level._2_2_,CONCAT11(local_1a8.level._1_1_,(undefined1)local_1a8.level)
                  );
  (this->chunk).offset = uVar7;
  (this->chunk).sort_offset = uVar7;
  uVar6 = (i->version).value;
  if (uVar6 < 0x4000100) {
    uVar13 = 0;
  }
  else {
    std::istream::read((char *)is,(long)&local_1a8);
    uVar13 = CONCAT44(local_1a8._4_4_,
                      CONCAT22(local_1a8.level._2_2_,
                               CONCAT11(local_1a8.level._1_1_,(undefined1)local_1a8.level)));
    uVar6 = (i->version).value;
  }
  (this->file).offset = uVar13;
  if (uVar6 < 0x4000000) {
    std::istream::read((char *)is,(long)&local_1a8);
    (this->file).size =
         (ulong)CONCAT22(local_1a8.level._2_2_,
                         CONCAT11(local_1a8.level._1_1_,(undefined1)local_1a8.level));
    std::istream::read((char *)is,(long)&local_1a8);
    uVar11 = (ulong)CONCAT22(local_1a8.level._2_2_,
                             CONCAT11(local_1a8.level._1_1_,(undefined1)local_1a8.level));
  }
  else {
    std::istream::read((char *)is,(long)&local_1a8);
    (this->file).size =
         CONCAT44(local_1a8._4_4_,
                  CONCAT22(local_1a8.level._2_2_,
                           CONCAT11(local_1a8.level._1_1_,(undefined1)local_1a8.level)));
    std::istream::read((char *)is,(long)&local_1a8);
    uVar11 = CONCAT44(local_1a8._4_4_,
                      CONCAT22(local_1a8.level._2_2_,
                               CONCAT11(local_1a8.level._1_1_,(undefined1)local_1a8.level)));
  }
  (this->chunk).size = uVar11;
  this->uncompressed_size = (this->file).size;
  uVar6 = (i->version).value;
  if (uVar6 < 0x6040000) {
    if (uVar6 < 0x5030900) {
      if (uVar6 < 0x4020000) {
        if (uVar6 < 0x4000100) {
          std::istream::read((char *)is,(long)&local_1a8);
          (this->file).checksum.field_0.adler32 =
               CONCAT22(local_1a8.level._2_2_,
                        CONCAT11(local_1a8.level._1_1_,(undefined1)local_1a8.level));
          (this->file).checksum.type = Adler32;
        }
        else {
          std::istream::read((char *)is,(long)&local_1a8);
          (this->file).checksum.field_0.adler32 =
               CONCAT22(local_1a8.level._2_2_,
                        CONCAT11(local_1a8.level._1_1_,(undefined1)local_1a8.level));
          (this->file).checksum.type = CRC32;
        }
      }
      else {
        std::istream::read((char *)is,(long)&(this->file).checksum);
        (this->file).checksum.type = MD5;
      }
    }
    else {
      std::istream::read((char *)is,(long)&(this->file).checksum);
      (this->file).checksum.type = SHA1;
    }
  }
  else {
    std::istream::read((char *)is,(long)&(this->file).checksum);
    (this->file).checksum.type = SHA256;
  }
  if (((i->version).variant._flags.super__Base_bitset<1UL>._M_w & 1) == 0) {
    std::istream::read((char *)is,(long)&local_1a8);
    lVar14 = CONCAT44(local_1a8._4_4_,
                      CONCAT22(local_1a8.level._2_2_,
                               CONCAT11(local_1a8.level._1_1_,(undefined1)local_1a8.level)));
    if (lVar14 < 0x19db1ded53e8000) {
      poVar1 = &local_1a8.buffer;
      local_1a8.level._0_1_ = Warning;
      local_1a8.level._1_1_ = Debug >> 8;
      local_1a8.level._2_2_ = Debug >> 0x10;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"Unexpected filetime: ",0x15);
      std::ostream::_M_insert<long>((long)poVar1);
      logger::~logger(&local_1a8);
    }
    lVar14 = lVar14 + -0x19db1ded53e8000;
    lVar2 = lVar14 / 10000000;
    this->timestamp = lVar2;
    uVar7 = ((int)lVar14 + (int)lVar2 * -10000000) * 100;
  }
  else {
    std::istream::read((char *)is,(long)&local_1a8);
    uVar5 = local_1a8.level._1_1_;
    std::istream::read((char *)is,(long)&local_1a8);
    auVar3 = ZEXT1648(CONCAT88(CONCAT44(((byte)local_1a8.level._1_1_ >> 1) + 0x50,
                                        ((ushort)(CONCAT11(local_1a8.level._1_1_,
                                                           (undefined1)local_1a8.level) >> 5) & 0xf)
                                        - 1),
                               (ulong)CONCAT24(CONCAT11(local_1a8.level._1_1_,
                                                        (undefined1)local_1a8.level),
                                               (uint)((byte)uVar5 >> 3)) & 0x1fffffffff));
    tm.tm_zone = in_stack_fffffffffffffdf0;
    tm.tm_sec = auVar3._0_4_;
    tm.tm_min = auVar3._4_4_;
    tm.tm_hour = auVar3._8_4_;
    tm.tm_mday = auVar3._12_4_;
    tm.tm_mon = auVar3._16_4_;
    tm.tm_year = auVar3._20_4_;
    tm.tm_wday = auVar3._24_4_;
    tm.tm_yday = auVar3._28_4_;
    tm.tm_isdst = auVar3._32_4_;
    tm._36_4_ = auVar3._36_4_;
    tm.tm_gmtoff = auVar3._40_8_;
    tVar9 = util::parse_time(tm);
    this->timestamp = tVar9;
    uVar7 = 0;
  }
  this->timestamp_nsec = uVar7;
  std::istream::read((char *)is,(long)&local_1a8);
  uVar4 = CONCAT22(local_1a8.level._2_2_,CONCAT11(local_1a8.level._1_1_,(undefined1)local_1a8.level)
                  );
  std::istream::read((char *)is,(long)&local_1a8);
  this->file_version =
       CONCAT44(uVar4,CONCAT22(local_1a8.level._2_2_,
                               CONCAT11(local_1a8.level._1_1_,(undefined1)local_1a8.level)));
  (this->options)._flags.super__Base_bitset<1UL>._M_w = 0;
  stored_flag_reader<setup::data_entry::flags_Enum_>::add
            ((stored_flag_reader<setup::data_entry::flags_Enum_> *)&stack0xfffffffffffffdf0,
             VersionInfoValid);
  stored_flag_reader<setup::data_entry::flags_Enum_>::add
            ((stored_flag_reader<setup::data_entry::flags_Enum_> *)&stack0xfffffffffffffdf0,
             VersionInfoNotValid);
  uVar6 = (i->version).value;
  if (0x20010ff < uVar6) {
    if (uVar6 < 0x4000100) {
      stored_flag_reader<setup::data_entry::flags_Enum_>::add
                ((stored_flag_reader<setup::data_entry::flags_Enum_> *)&stack0xfffffffffffffdf0,
                 BZipped);
      uVar6 = (i->version).value;
    }
    if (((((0x40009ff < uVar6) &&
          (stored_flag_reader<setup::data_entry::flags_Enum_>::add
                     ((stored_flag_reader<setup::data_entry::flags_Enum_> *)&stack0xfffffffffffffdf0
                      ,TimeStampInUTC), 0x400ffff < (i->version).value)) &&
         (stored_flag_reader<setup::data_entry::flags_Enum_>::add
                    ((stored_flag_reader<setup::data_entry::flags_Enum_> *)&stack0xfffffffffffffdf0,
                     IsUninstallerExe), 0x40107ff < (i->version).value)) &&
        ((stored_flag_reader<setup::data_entry::flags_Enum_>::add
                    ((stored_flag_reader<setup::data_entry::flags_Enum_> *)&stack0xfffffffffffffdf0,
                     CallInstructionOptimized), 0x401ffff < (i->version).value &&
         (stored_flag_reader<setup::data_entry::flags_Enum_>::add
                    ((stored_flag_reader<setup::data_entry::flags_Enum_> *)&stack0xfffffffffffffdf0,
                     Touch), 0x40201ff < (i->version).value)))) &&
       (stored_flag_reader<setup::data_entry::flags_Enum_>::add
                  ((stored_flag_reader<setup::data_entry::flags_Enum_> *)&stack0xfffffffffffffdf0,
                   ChunkEncrypted), 0x40204ff < (i->version).value)) {
      stored_flag_reader<setup::data_entry::flags_Enum_>::add
                ((stored_flag_reader<setup::data_entry::flags_Enum_> *)&stack0xfffffffffffffdf0,
                 ChunkCompressed);
      if ((0x5010cff < (i->version).value) &&
         (stored_flag_reader<setup::data_entry::flags_Enum_>::add
                    ((stored_flag_reader<setup::data_entry::flags_Enum_> *)&stack0xfffffffffffffdf0,
                     SolidBreak), (i->version).value + 0xfafaf900 < 0xfdf900)) {
        stored_flag_reader<setup::data_entry::flags_Enum_>::add
                  ((stored_flag_reader<setup::data_entry::flags_Enum_> *)&stack0xfffffffffffffdf0,
                   Sign);
        stored_flag_reader<setup::data_entry::flags_Enum_>::add
                  ((stored_flag_reader<setup::data_entry::flags_Enum_> *)&stack0xfffffffffffffdf0,
                   SignOnce);
      }
      goto LAB_00134ab5;
    }
  }
  *(byte *)&(this->options)._flags.super__Base_bitset<1UL>._M_w =
       (byte)(this->options)._flags.super__Base_bitset<1UL>._M_w | 0x80;
LAB_00134ab5:
  uVar11 = (this->options)._flags.super__Base_bitset<1UL>._M_w;
  (this->options)._flags.super__Base_bitset<1UL>._M_w = uVar11;
  if ((i->version).value < 0x6030000) {
    if (((uint)uVar11 >> 10 & 1) == 0) {
      if (((uint)uVar11 >> 9 & 1) == 0) {
        this->sign = NoSetting;
      }
      else {
        this->sign = Yes;
      }
    }
    else {
      this->sign = Once;
    }
  }
  else {
    std::istream::read((char *)is,(long)&local_1a8);
    if ((ulong)(byte)(undefined1)local_1a8.level < 4) {
      sVar8 = *(sign_mode *)
               ("[expand 32-byte k" + (ulong)(byte)(undefined1)local_1a8.level * 4 + 0x11);
    }
    else {
      local_1a8.level._0_1_ = Warning;
      local_1a8.level._1_1_ = Debug >> 8;
      local_1a8.level._2_2_ = Debug >> 0x10;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8.buffer);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8.buffer,"Unexpected ",0xb);
      plVar10 = logger::operator<<(&local_1a8,&enum_names<setup::data_entry::sign_mode>::name);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&plVar10->buffer," value: ",8);
      std::ostream::_M_insert<unsigned_long>((ulong)&plVar10->buffer);
      logger::~logger(&local_1a8);
      sVar8 = NoSetting;
    }
    this->sign = sVar8;
    uVar11 = (this->options)._flags.super__Base_bitset<1UL>._M_w;
  }
  cVar12 = Stored;
  if ((char)uVar11 < '\0') {
    cVar12 = (i->header).compression;
  }
  (this->chunk).compression = cVar12;
  if (((uint)uVar11 >> 0xb & 1) != 0) {
    uVar11 = uVar11 | 0x80;
    (this->options)._flags.super__Base_bitset<1UL>._M_w = uVar11;
    (this->chunk).compression = BZip2;
  }
  if ((uVar11 & 0x40) == 0) {
    (this->chunk).encryption = Plaintext;
  }
  else {
    uVar6 = (i->version).value;
    if (uVar6 < 0x6040000) {
      if (uVar6 < 0x5030900) {
        (this->chunk).encryption = ARC4_MD5;
      }
      else {
        (this->chunk).encryption = ARC4_SHA1;
      }
    }
    else {
      (this->chunk).encryption = XChaCha20;
    }
  }
  if ((uVar11 & 0x10) == 0) {
    (this->file).filter = NoFilter;
  }
  else {
    uVar6 = (i->version).value;
    if (uVar6 < 0x5020000) {
      (this->file).filter = InstructionFilter4108;
    }
    else if (uVar6 < 0x5030900) {
      (this->file).filter = InstructionFilter5200;
    }
    else {
      (this->file).filter = InstructionFilter5309;
    }
  }
  return;
}

Assistant:

void data_entry::load(std::istream & is, const info & i) {
	
	chunk.first_slice = util::load<boost::uint32_t>(is, i.version.bits());
	chunk.last_slice = util::load<boost::uint32_t>(is, i.version.bits());
	if(i.version < INNO_VERSION(4, 0, 0)) {
		if(chunk.first_slice < 1 || chunk.last_slice < 1) {
			log_warning << "Unexpected slice number: " << chunk.first_slice
			            << " to " << chunk.last_slice;
		} else {
			chunk.first_slice--, chunk.last_slice--;
		}
	}
	
	chunk.sort_offset = chunk.offset = util::load<boost::uint32_t>(is);
	
	if(i.version >= INNO_VERSION(4, 0, 1)) {
		file.offset = util::load<boost::uint64_t>(is);
	} else {
		file.offset = 0;
	}
	
	if(i.version >= INNO_VERSION(4, 0, 0)) {
		file.size = util::load<boost::uint64_t>(is);
		chunk.size = util::load<boost::uint64_t>(is);
	} else {
		file.size = util::load<boost::uint32_t>(is);
		chunk.size = util::load<boost::uint32_t>(is);
	}
	uncompressed_size = file.size;
	
	if(i.version >= INNO_VERSION(6, 4, 0)) {
		is.read(file.checksum.sha256, std::streamsize(sizeof(file.checksum.sha256)));
		file.checksum.type = crypto::SHA256;
	} else if(i.version >= INNO_VERSION(5, 3, 9)) {
		is.read(file.checksum.sha1, std::streamsize(sizeof(file.checksum.sha1)));
		file.checksum.type = crypto::SHA1;
	} else if(i.version >= INNO_VERSION(4, 2, 0)) {
		is.read(file.checksum.md5, std::streamsize(sizeof(file.checksum.md5)));
		file.checksum.type = crypto::MD5;
	} else if(i.version >= INNO_VERSION(4, 0, 1)) {
		file.checksum.crc32 = util::load<boost::uint32_t>(is);
		file.checksum.type = crypto::CRC32;
	} else {
		file.checksum.adler32 = util::load<boost::uint32_t>(is);
		file.checksum.type = crypto::Adler32;
	}
	
	if(i.version.bits() == 16) {
		
		// 16-bit installers use the FAT filetime format
		
		boost::uint16_t time = util::load<boost::uint16_t>(is);
		boost::uint16_t date = util::load<boost::uint16_t>(is);
		
		struct tm t;
		std::memset(&t, 0, sizeof(t));
		t.tm_sec  = util::get_bits(time,  0,  4) * 2;           // [0, 58]
		t.tm_min  = util::get_bits(time,  5, 10);               // [0, 59]
		t.tm_hour = util::get_bits(time, 11, 15);               // [0, 23]
		t.tm_mday = util::get_bits(date,  0,  4);               // [1, 31]
		t.tm_mon  = util::get_bits(date,  5,  8) - 1;           // [0, 11]
		t.tm_year = util::get_bits(date,  9, 15) + 1980 - 1900; // [80, 199]
		
		timestamp = util::parse_time(t);
		timestamp_nsec = 0;
		
	} else {
		
		// 32-bit installers use the Win32 FILETIME format
		
		boost::int64_t filetime = util::load<boost::int64_t>(is);
		
		static const boost::int64_t FiletimeOffset = 0x19DB1DED53E8000ll;
		if(filetime < FiletimeOffset) {
			log_warning << "Unexpected filetime: " << filetime;
		}
		filetime -= FiletimeOffset;
		
		timestamp = filetime / 10000000;
		timestamp_nsec = boost::uint32_t(filetime % 10000000) * 100;
		
	}
	
	boost::uint32_t file_version_ms = util::load<boost::uint32_t>(is);
	boost::uint32_t file_version_ls = util::load<boost::uint32_t>(is);
	file_version = (boost::uint64_t(file_version_ms) << 32)
	             |  boost::uint64_t(file_version_ls);
	
	options = 0;
	
	stored_flag_reader<flags> flagreader(is, i.version.bits());
	
	flagreader.add(VersionInfoValid);
	flagreader.add(VersionInfoNotValid);
	if(i.version >= INNO_VERSION(2, 0, 17) && i.version < INNO_VERSION(4, 0, 1)) {
		flagreader.add(BZipped);
	}
	if(i.version >= INNO_VERSION(4, 0, 10)) {
		flagreader.add(TimeStampInUTC);
	}
	if(i.version >= INNO_VERSION(4, 1, 0)) {
		flagreader.add(IsUninstallerExe);
	}
	if(i.version >= INNO_VERSION(4, 1, 8)) {
		flagreader.add(CallInstructionOptimized);
	}
	if(i.version >= INNO_VERSION(4, 2, 0)) {
		flagreader.add(Touch);
	}
	if(i.version >= INNO_VERSION(4, 2, 2)) {
		flagreader.add(ChunkEncrypted);
	}
	if(i.version >= INNO_VERSION(4, 2, 5)) {
		flagreader.add(ChunkCompressed);
	} else {
		options |= ChunkCompressed;
	}
	if(i.version >= INNO_VERSION(5, 1, 13)) {
		flagreader.add(SolidBreak);
	}
	if(i.version >= INNO_VERSION(5, 5, 7) && i.version < INNO_VERSION(6, 3, 0)) {
		// Actually added in Inno Setup 5.5.9 but the data version was not bumped
		flagreader.add(Sign);
		flagreader.add(SignOnce);
	}
	
	options |= flagreader.finalize();
	
	if(i.version >= INNO_VERSION(6, 3, 0)) {
		sign = stored_enum<stored_sign_mode>(is).get();
	} else if(options & SignOnce) {
		sign = Once;
	} else if(options & Sign) {
		sign = Yes;
	} else {
		sign = NoSetting;
	}
	
	if(options & ChunkCompressed) {
		chunk.compression = i.header.compression;
	} else {
		chunk.compression = stream::Stored;
	}
	if(options & BZipped) {
		options |= ChunkCompressed;
		chunk.compression = stream::BZip2;
	}
	
	if(options & ChunkEncrypted) {
		if(i.version >= INNO_VERSION(6, 4, 0)) {
			chunk.encryption = stream::XChaCha20;
		} else if(i.version >= INNO_VERSION(5, 3, 9)) {
			chunk.encryption = stream::ARC4_SHA1;
		} else {
			chunk.encryption = stream::ARC4_MD5;
		}
	} else {
		chunk.encryption = stream::Plaintext;
	}
	
	if(options & CallInstructionOptimized) {
		if(i.version < INNO_VERSION(5, 2, 0)) {
			file.filter = stream::InstructionFilter4108;
		} else if(i.version < INNO_VERSION(5, 3, 9)) {
			file.filter = stream::InstructionFilter5200;
		} else {
			file.filter = stream::InstructionFilter5309;
		}
	} else {
		file.filter = stream::NoFilter;
	}
}